

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# applications_pool.cpp
# Opt level: O3

intrusive_ptr<cppcms::application> __thiscall
cppcms::application_specific_pool::_async_policy::get_async
          (_async_policy *this,io_service *io_srv,service *srv)

{
  application *app;
  runtime_error *this_00;
  long in_RCX;
  string local_40;
  
  app = *(application **)(io_srv + 0x18);
  if (app == (application *)0x0) {
    if (in_RCX == 0) {
      (this->super__policy)._vptr__policy = (_func_int **)0x0;
    }
    else {
      (**(code **)(*(long *)io_srv + 0x28))(this);
    }
  }
  else {
    if (*(service **)(io_srv + 0x20) != srv) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x30);
      local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_40,
                 "given booster::aio::io_service isn\'t main event loop io_service","");
      booster::runtime_error::runtime_error(this_00,&local_40);
      *(undefined ***)this_00 = &PTR__runtime_error_00284840;
      (this_00->super_backtrace)._vptr_backtrace = (_func_int **)&PTR__cppcms_error_00284868;
      __cxa_throw(this_00,&cppcms_error::typeinfo,booster::runtime_error::~runtime_error);
    }
    (this->super__policy)._vptr__policy = (_func_int **)app;
    booster::intrusive_ptr_add_ref(app);
  }
  return (intrusive_ptr<cppcms::application>)(application *)this;
}

Assistant:

virtual booster::intrusive_ptr<application> get_async(booster::aio::io_service &io_srv,cppcms::service *srv = 0) 
	{

		if(app_) {
			if(&io_srv == io_srv_)
				return app_;
			else
				throw cppcms_error("given booster::aio::io_service isn't main event loop io_service");
		}
		if(!srv)
			return 0;
		return get(*srv);
	}